

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox.cpp
# Opt level: O0

void __thiscall QComboBox::setModel(QComboBox *this,QAbstractItemModel *model)

{
  bool bVar1;
  QComboBoxPrivate *pQVar2;
  QCompleter *pQVar3;
  QObject *pQVar4;
  QComboBoxPrivateContainer *pQVar5;
  QAbstractItemView *pQVar6;
  QAbstractItemModel *in_RSI;
  QObject *in_RDI;
  long in_FS_OFFSET;
  QComboBoxPrivate *d;
  char *in_stack_ffffffffffffff58;
  QComboBoxPrivate *in_stack_ffffffffffffff60;
  QModelIndex *in_stack_ffffffffffffff68;
  QComboBoxPrivate *in_stack_ffffffffffffff70;
  QCompleter *in_stack_ffffffffffffff80;
  QComboBoxPrivate *in_stack_ffffffffffffff88;
  ConnectionType in_stack_ffffffffffffffb4;
  Object *in_stack_ffffffffffffffb8;
  Connection local_30;
  char local_28 [8];
  Function in_stack_ffffffffffffffe0;
  offset_in_QItemSelectionModel_to_subr in_stack_fffffffffffffff0;
  QComboBoxPrivate *this_00;
  
  this_00 = *(QComboBoxPrivate **)(in_FS_OFFSET + 0x28);
  pQVar2 = d_func((QComboBox *)0x538e65);
  if (in_RSI == (QAbstractItemModel *)0x0) {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)in_stack_ffffffffffffff70,(char *)in_stack_ffffffffffffff68,
               (int)((ulong)in_stack_ffffffffffffff60 >> 0x20),in_stack_ffffffffffffff58);
    QMessageLogger::warning(local_28,"QComboBox::setModel: cannot set a 0 model");
  }
  else if (in_RSI != pQVar2->model) {
    if ((pQVar2->lineEdit != (QLineEdit *)0x0) &&
       (pQVar3 = QLineEdit::completer((QLineEdit *)in_stack_ffffffffffffff60),
       pQVar3 != (QCompleter *)0x0)) {
      QLineEdit::completer((QLineEdit *)in_stack_ffffffffffffff60);
      QCompleter::setModel(in_stack_ffffffffffffff80,(QAbstractItemModel *)in_RDI);
    }
    QComboBoxPrivate::disconnectModel(in_stack_ffffffffffffff70);
    if ((pQVar2->model != (QAbstractItemModel *)0x0) &&
       (pQVar4 = QObject::parent((QObject *)0x538f36), pQVar4 == in_RDI)) {
      in_stack_ffffffffffffff70 = (QComboBoxPrivate *)pQVar2->model;
      if (in_stack_ffffffffffffff70 != (QComboBoxPrivate *)0x0) {
        (**(code **)(*(long *)&in_stack_ffffffffffffff70->super_QWidgetPrivate + 0x20))();
      }
      pQVar2->model = (QAbstractItemModel *)0x0;
    }
    pQVar2->model = in_RSI;
    bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QComboBoxPrivateContainer> *)0x538f94);
    if (bVar1) {
      pQVar5 = QPointer<QComboBoxPrivateContainer>::operator->
                         ((QPointer<QComboBoxPrivateContainer> *)0x538fae);
      pQVar6 = QComboBoxPrivateContainer::itemView(pQVar5);
      (**(code **)(*(long *)&(pQVar6->super_QAbstractScrollArea).super_QFrame.super_QWidget + 0x1c8)
      )(pQVar6,in_RSI);
      pQVar5 = QPointer<QComboBoxPrivateContainer>::operator->
                         ((QPointer<QComboBoxPrivateContainer> *)0x538fdb);
      QComboBoxPrivateContainer::itemView(pQVar5);
      QAbstractItemView::selectionModel((QAbstractItemView *)in_stack_ffffffffffffff60);
      in_stack_ffffffffffffff88 = (QComboBoxPrivate *)0x0;
      in_stack_ffffffffffffff60 = (QComboBoxPrivate *)0x0;
      QObjectPrivate::
      connect<void(QItemSelectionModel::*)(QModelIndex_const&,QModelIndex_const&),void(QComboBoxPrivate::*)(QModelIndex_const&)>
                ((Object *)QComboBoxPrivate::emitHighlighted,in_stack_fffffffffffffff0,
                 in_stack_ffffffffffffffb8,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffb4);
      QMetaObject::Connection::~Connection(&local_30);
    }
    QComboBoxPrivate::connectModel(this_00);
    QModelIndex::QModelIndex((QModelIndex *)0x53906a);
    setRootModelIndex((QComboBox *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    QComboBoxPrivate::trySetValidIndex(in_stack_ffffffffffffff88);
    QComboBoxPrivate::modelChanged(in_stack_ffffffffffffff60);
  }
  if (*(QComboBoxPrivate **)(in_FS_OFFSET + 0x28) != this_00) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QComboBox::setModel(QAbstractItemModel *model)
{
    Q_D(QComboBox);

    if (Q_UNLIKELY(!model)) {
        qWarning("QComboBox::setModel: cannot set a 0 model");
        return;
    }

    if (model == d->model)
        return;

#if QT_CONFIG(completer)
    if (d->lineEdit && d->lineEdit->completer())
        d->lineEdit->completer()->setModel(model);
#endif
    d->disconnectModel();
    if (d->model && d->model->QObject::parent() == this) {
        delete d->model;
        d->model = nullptr;
    }

    d->model = model;

    if (d->container) {
        d->container->itemView()->setModel(model);
        QObjectPrivate::connect(d->container->itemView()->selectionModel(),
                                &QItemSelectionModel::currentChanged,
                                d, &QComboBoxPrivate::emitHighlighted, Qt::UniqueConnection);
    }

    d->connectModel();

    setRootModelIndex(QModelIndex());

    d->trySetValidIndex();
    d->modelChanged();
}